

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::bitcast_glsl_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  CompilerError *pCVar1;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d [20];
  allocator local_29;
  SPIRType *local_28;
  SPIRType *in_type_local;
  SPIRType *out_type_local;
  CompilerHLSL *this_local;
  
  local_28 = in_type;
  in_type_local = out_type;
  out_type_local = (SPIRType *)this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  if ((out_type->basetype == UInt) && (in_type->basetype == Int)) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (__return_storage_ptr__,this,out_type,0);
  }
  else if ((out_type->basetype == UInt64) && (in_type->basetype == Int64)) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (__return_storage_ptr__,this,out_type,0);
  }
  else if ((out_type->basetype == UInt) && (in_type->basetype == Float)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"asuint",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else if ((out_type->basetype == Int) && (in_type->basetype == UInt)) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (__return_storage_ptr__,this,out_type,0);
  }
  else if ((out_type->basetype == Int64) && (in_type->basetype == UInt64)) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (__return_storage_ptr__,this,out_type,0);
  }
  else if ((out_type->basetype == Int) && (in_type->basetype == Float)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"asint",local_3d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_3d);
  }
  else if ((out_type->basetype == Float) && (in_type->basetype == UInt)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"asfloat",&local_3e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3e);
  }
  else if ((out_type->basetype == Float) && (in_type->basetype == Int)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"asfloat",&local_3f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3f);
  }
  else {
    if ((out_type->basetype == Int64) && (in_type->basetype == Double)) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar1,"Double to Int64 is not supported in HLSL.");
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((out_type->basetype == UInt64) && (in_type->basetype == Double)) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar1,"Double to UInt64 is not supported in HLSL.");
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((out_type->basetype == Double) && (in_type->basetype == Int64)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"asdouble",&local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_40);
    }
    else if ((out_type->basetype == Double) && (in_type->basetype == UInt64)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"asdouble",&local_41);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    else if (((out_type->basetype == Half) && (in_type->basetype == UInt)) &&
            (in_type->vecsize == 1)) {
      if ((this->requires_explicit_fp16_packing & 1U) == 0) {
        this->requires_explicit_fp16_packing = true;
        Compiler::force_recompile((Compiler *)this);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"spvUnpackFloat2x16",&local_42);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_42);
    }
    else if (((out_type->basetype == UInt) && (in_type->basetype == Half)) &&
            (in_type->vecsize == 2)) {
      if ((this->requires_explicit_fp16_packing & 1U) == 0) {
        this->requires_explicit_fp16_packing = true;
        Compiler::force_recompile((Compiler *)this);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"spvPackFloat2x16",&local_43);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_43);
    }
    else if ((out_type->basetype == UShort) && (in_type->basetype == Half)) {
      if ((this->hlsl_options).shader_model < 0x28) {
        pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar1,"Half to UShort requires Shader Model 4.");
        __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_88,this,out_type,0);
      ::std::operator+(&local_68,"(",&local_88);
      ::std::operator+(__return_storage_ptr__,&local_68,")f32tof16");
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_88);
    }
    else if ((out_type->basetype == Half) && (in_type->basetype == UShort)) {
      if ((this->hlsl_options).shader_model < 0x28) {
        pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar1,"UShort to Half requires Shader Model 4.");
        __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c8,this,out_type,0);
      ::std::operator+(&local_a8,"(",&local_c8);
      ::std::operator+(__return_storage_ptr__,&local_a8,")f16tof32");
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::__cxx11::string::~string((string *)&local_c8);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_c9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Int)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Int64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
		return "asuint";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::UInt)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::UInt64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
		return "asint";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to Int64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to UInt64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "spvUnpackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "spvPackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
	{
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("Half to UShort requires Shader Model 4.");
		return "(" + type_to_glsl(out_type) + ")f32tof16";
	}
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
	{
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("UShort to Half requires Shader Model 4.");
		return "(" + type_to_glsl(out_type) + ")f16tof32";
	}
	else
		return "";
}